

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall bssl::Vector<NotDefaultConstructible>::clear(Vector<NotDefaultConstructible> *this)

{
  Vector<NotDefaultConstructible> *this_local;
  
  std::
  destroy_n<bssl::(anonymous_namespace)::VectorTest_NotDefaultConstructible_Test::TestBody()::NotDefaultConstructible*,unsigned_long>
            (this->data_,this->size_);
  OPENSSL_free(this->data_);
  this->data_ = (NotDefaultConstructible *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }